

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

LLVMValueRef CompileLlvmIfElse(LlvmCompilationContext *ctx,ExprIfElse *node)

{
  LLVMBuilderRef pLVar1;
  int iVar2;
  LLVMValueRef pLVar3;
  TypeBase *type;
  LLVMTypeRef pLVar4;
  LLVMValueRef pLVar5;
  LLVMBasicBlockRef pLVar6;
  LLVMBasicBlockRef pLVar7;
  LLVMBasicBlockRef pLVar8;
  LLVMBasicBlockRef exitBlock;
  LLVMBasicBlockRef falseBlock;
  LLVMBasicBlockRef trueBlock;
  LLVMValueRef condition;
  ExprIfElse *node_local;
  LlvmCompilationContext *ctx_local;
  
  pLVar3 = CompileLlvm(ctx,node->condition);
  iVar2 = LLVMIntNE;
  pLVar1 = ctx->builder;
  type = GetStackType(ctx,node->condition->type);
  pLVar4 = CompileLlvmType(ctx,type);
  pLVar5 = LLVMConstInt(pLVar4,0,true);
  pLVar3 = LLVMBuildICmp(pLVar1,iVar2,pLVar3,pLVar5,"");
  pLVar6 = LLVMAppendBasicBlockInContext(ctx->context,ctx->currentFunction,"if_true");
  pLVar7 = LLVMAppendBasicBlockInContext(ctx->context,ctx->currentFunction,"if_false");
  pLVar8 = LLVMAppendBasicBlockInContext(ctx->context,ctx->currentFunction,"if_exit");
  if (node->falseBlock == (ExprBase *)0x0) {
    LLVMBuildCondBr(ctx->builder,pLVar3,pLVar6,pLVar8);
  }
  else {
    LLVMBuildCondBr(ctx->builder,pLVar3,pLVar6,pLVar7);
  }
  LLVMPositionBuilderAtEnd(ctx->builder,pLVar6);
  CompileLlvm(ctx,node->trueBlock);
  LLVMBuildBr(ctx->builder,pLVar8);
  LLVMPositionBuilderAtEnd(ctx->builder,pLVar7);
  if (node->falseBlock != (ExprBase *)0x0) {
    CompileLlvm(ctx,node->falseBlock);
  }
  LLVMBuildBr(ctx->builder,pLVar8);
  LLVMPositionBuilderAtEnd(ctx->builder,pLVar8);
  pLVar3 = CheckType(ctx,&node->super_ExprBase,(LLVMValueRef)0x0);
  return pLVar3;
}

Assistant:

LLVMValueRef CompileLlvmIfElse(LlvmCompilationContext &ctx, ExprIfElse *node)
{
	LLVMValueRef condition = CompileLlvm(ctx, node->condition);

	condition = LLVMBuildICmp(ctx.builder, LLVMIntNE, condition, LLVMConstInt(CompileLlvmType(ctx, GetStackType(ctx, node->condition->type)), 0, true), "");

	LLVMBasicBlockRef trueBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "if_true");
	LLVMBasicBlockRef falseBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "if_false");
	LLVMBasicBlockRef exitBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "if_exit");

	if(node->falseBlock)
		LLVMBuildCondBr(ctx.builder, condition, trueBlock, falseBlock);
	else
		LLVMBuildCondBr(ctx.builder, condition, trueBlock, exitBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, trueBlock);

	CompileLlvm(ctx, node->trueBlock);

	LLVMBuildBr(ctx.builder, exitBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, falseBlock);

	if(node->falseBlock)
		CompileLlvm(ctx, node->falseBlock);

	LLVMBuildBr(ctx.builder, exitBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, exitBlock);

	return CheckType(ctx, node, NULL);
}